

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.h
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencyPluralInfoWrapper::~CurrencyPluralInfoWrapper
          (CurrencyPluralInfoWrapper *this)

{
  CurrencyPluralInfoWrapper *this_local;
  
  LocalPointer<icu_63::CurrencyPluralInfo>::~LocalPointer(&this->fPtr);
  return;
}

Assistant:

class U_I18N_API CurrencyPluralInfoWrapper {
public:
    LocalPointer<CurrencyPluralInfo> fPtr;

    CurrencyPluralInfoWrapper() = default;

    CurrencyPluralInfoWrapper(const CurrencyPluralInfoWrapper& other) {
        if (!other.fPtr.isNull()) {
            fPtr.adoptInstead(new CurrencyPluralInfo(*other.fPtr));
        }
    }

    CurrencyPluralInfoWrapper& operator=(const CurrencyPluralInfoWrapper& other) {
        if (!other.fPtr.isNull()) {
            fPtr.adoptInstead(new CurrencyPluralInfo(*other.fPtr));
        }
        return *this;
    }
}